

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_support.c
# Opt level: O0

void test_filter_or_format(undefined1 *enable)

{
  undefined1 *in_stack_00000008;
  constructor *in_stack_00000010;
  undefined1 *in_stack_00000018;
  constructor *in_stack_00000020;
  
  test_success(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  test_failure(in_stack_00000010,in_stack_00000008,enable);
  test_failure(in_stack_00000010,in_stack_00000008,enable);
  test_failure(in_stack_00000010,in_stack_00000008,enable);
  return;
}

Assistant:

static void
test_filter_or_format(enabler enable)
{
	test_success(archive_read_new, enable, archive_read_free);
	test_failure(archive_write_new, enable, archive_write_free);
	test_failure(archive_read_disk_new, enable, archive_read_free);
	test_failure(archive_write_disk_new, enable, archive_write_free);
}